

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamHeader.cpp
# Opt level: O0

string * __thiscall BamTools::SamHeader::GetErrorString_abi_cxx11_(SamHeader *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x138));
  return in_RDI;
}

Assistant:

std::string SamHeader::GetErrorString() const
{
    return m_errorString;
}